

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
* __thiscall
jessilib::vectorize_ntargs<char8_t,wchar_t_const>
          (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
           *__return_storage_ptr__,jessilib *this,wchar_t **in_ntarg_array)

{
  wchar_t *in_ntarg;
  jessilib *pjVar1;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this != (jessilib *)0x0) && (in_ntarg = *(wchar_t **)this, in_ntarg != (wchar_t *)0x0)) {
    pjVar1 = this + 8;
    do {
      ntarg_cast<char8_t,_const_wchar_t,_nullptr>(&local_40,in_ntarg);
      std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>::
      emplace_back<std::__cxx11::u8string>
                ((vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>> *)
                 __return_storage_ptr__,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      in_ntarg = *(wchar_t **)pjVar1;
      pjVar1 = pjVar1 + 8;
    } while (in_ntarg != (wchar_t *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::basic_string<OutCharT>> vectorize_ntargs(InCharT** in_ntarg_array) {
	std::vector<std::basic_string<OutCharT>> result;
	if (in_ntarg_array == nullptr) {
		return result;
	}

	for (auto argv = in_ntarg_array; *argv != nullptr; ++argv) {
		result.emplace_back(ntarg_cast<OutCharT, InCharT>(*argv));
	}

	return result;
}